

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.h
# Opt level: O1

void __thiscall
CoreML::Specification::Int64Vector::_internal_add_vector(Int64Vector *this,int64_t value)

{
  RepeatedField<long> *this_00;
  uint uVar1;
  uint uVar2;
  long *plVar3;
  long tmp;
  
  this_00 = &this->vector_;
  uVar1 = (this->vector_).current_size_;
  uVar2 = (this->vector_).total_size_;
  if (uVar1 == uVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this_00,uVar2 + 1);
  }
  plVar3 = google::protobuf::RepeatedField<long>::elements(this_00);
  plVar3[uVar1] = value;
  this_00->current_size_ = uVar1 + 1;
  return;
}

Assistant:

inline void Int64Vector::_internal_add_vector(int64_t value) {
  vector_.Add(value);
}